

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_tests.cpp
# Opt level: O2

Result<bilingual_str> *
result_tests::StrFn(Result<bilingual_str> *__return_storage_ptr__,bilingual_str s,bool success)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  int in_EDX;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffef8;
  bilingual_str local_e0;
  bilingual_str local_a0;
  bilingual_str local_60;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_EDX == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffff00,"str %s error.",
               (allocator<char> *)&stack0xfffffffffffffeff);
    Untranslated(&local_e0,in_stack_fffffffffffffef8);
    tinyformat::format<std::__cxx11::string>
              (&local_a0,(tinyformat *)&local_e0,
               (bilingual_str *)CONCAT71(in_register_00000031,success),in_RCX);
    std::__detail::__variant::_Variant_storage<false,bilingual_str,bilingual_str>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,bilingual_str> *)__return_storage_ptr__,
               &local_a0);
    bilingual_str::~bilingual_str(&local_a0);
    bilingual_str::~bilingual_str(&local_e0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
  }
  else {
    bilingual_str::bilingual_str(&local_60,(bilingual_str *)CONCAT71(in_register_00000031,success));
    std::__detail::__variant::_Variant_storage<false,bilingual_str,bilingual_str>::
    _Variant_storage<1ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,bilingual_str> *)__return_storage_ptr__,
               &local_60);
    bilingual_str::~bilingual_str(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<bilingual_str> StrFn(bilingual_str s, bool success)
{
    if (success) return s;
    return util::Error{strprintf(Untranslated("str %s error."), s.original)};
}